

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O2

string * __thiscall
picPageAnalyzer::getPrevPageURL_abi_cxx11_(string *__return_storage_ptr__,picPageAnalyzer *this)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"id=\"prev\"",&local_51);
  std::__cxx11::string::string((string *)&local_50,"href=\"",&local_52);
  pageAnalyzer::getInfoFromContent
            (__return_storage_ptr__,&this->super_pageAnalyzer,&local_30,0,0x12,&local_50,'\"');
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string picPageAnalyzer::getPrevPageURL()
{
    return this->getInfoFromContent(std::string("id=\"prev\""), 0, GETMODE_PART, std::string("href=\""), '\"');
}